

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_defines.hpp
# Opt level: O1

shared_ptr<chaiscript::detail::Type_Conversion_Base> __thiscall
chaiscript::
make_shared<chaiscript::detail::Type_Conversion_Base,chaiscript::detail::Type_Conversion_Impl<std::function<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>>,chaiscript::Type_Info_const&,chaiscript::Type_Info_const&,std::function<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>const&>
          (chaiscript *this,Type_Info *arg,Type_Info *arg_1,
          function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> *arg_2)

{
  Type_Conversion_Base *__p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> sVar2;
  _Any_data local_88;
  type_info *local_78;
  undefined8 uStack_70;
  type_info *local_68;
  type_info *ptStack_60;
  undefined8 local_58;
  type_info *local_48;
  type_info *ptStack_40;
  undefined8 local_38;
  
  __p = (Type_Conversion_Base *)operator_new(0x58);
  local_48 = arg->m_type_info;
  ptStack_40 = arg->m_bare_type_info;
  local_38 = *(undefined8 *)&arg->m_flags;
  local_68 = arg_1->m_type_info;
  ptStack_60 = arg_1->m_bare_type_info;
  local_58 = *(undefined8 *)&arg_1->m_flags;
  std::function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>::function
            ((function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> *)&local_88,arg_2)
  ;
  *(undefined8 *)&(__p->m_to).m_flags = local_58;
  (__p->m_to).m_type_info = local_68;
  (__p->m_to).m_bare_type_info = ptStack_60;
  (__p->m_from).m_type_info = local_48;
  (__p->m_from).m_bare_type_info = ptStack_40;
  *(undefined8 *)&(__p->m_from).m_flags = local_38;
  __p->_vptr_Type_Conversion_Base = (_func_int **)&PTR_convert_003220e8;
  __p[1]._vptr_Type_Conversion_Base = (_func_int **)0x0;
  __p[1].m_to.m_type_info = (type_info *)0x0;
  __p[1].m_to.m_bare_type_info = (type_info *)0x0;
  *(undefined8 *)&__p[1].m_to.m_flags = uStack_70;
  if (local_78 != (type_info *)0x0) {
    __p[1]._vptr_Type_Conversion_Base = (_func_int **)local_88._M_unused._0_8_;
    __p[1].m_to.m_type_info = (type_info *)local_88._8_8_;
    __p[1].m_to.m_bare_type_info = local_78;
    local_78 = (type_info *)0x0;
    uStack_70 = 0;
  }
  *(Type_Conversion_Base **)this = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chaiscript::detail::Type_Conversion_Base*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
  _Var1._M_pi = extraout_RDX;
  if (local_78 != (type_info *)0x0) {
    (*(code *)local_78)(&local_88,&local_88,3);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<chaiscript::detail::Type_Conversion_Base>)
         sVar2.
         super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<B> make_shared(Arg && ... arg)
  {
#ifdef CHAISCRIPT_USE_STD_MAKE_SHARED
    return std::make_shared<D>(std::forward<Arg>(arg)...);
#else
    return std::shared_ptr<B>(static_cast<B*>(new D(std::forward<Arg>(arg)...)));
#endif
  }